

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLNode_search_attribute(XMLNode *node,SXML_CHAR *attr_name,int i_search)

{
  int iVar1;
  int local_28;
  int i;
  int i_search_local;
  SXML_CHAR *attr_name_local;
  XMLNode *node_local;
  
  if ((((node != (XMLNode *)0x0) && (attr_name != (SXML_CHAR *)0x0)) && (*attr_name != '\0')) &&
     ((-1 < i_search && (local_28 = i_search, i_search < node->n_attributes)))) {
    for (; local_28 < node->n_attributes; local_28 = local_28 + 1) {
      if ((node->attributes[local_28].active != 0) &&
         (iVar1 = strcmp(node->attributes[local_28].name,attr_name), iVar1 == 0)) {
        return local_28;
      }
    }
  }
  return -1;
}

Assistant:

int XMLNode_search_attribute(const XMLNode* node, const SXML_CHAR* attr_name, int i_search)
{
	int i;
	
	if (node == NULL || attr_name == NULL || attr_name[0] == NULC || i_search < 0 || i_search >= node->n_attributes)
		return -1;
	
	for (i = i_search; i < node->n_attributes; i++)
		if (node->attributes[i].active && !sx_strcmp(node->attributes[i].name, attr_name))
			return i;
	
	return -1;
}